

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O0

int chachapoly_pad_ciphertext(mbedtls_chachapoly_context *ctx)

{
  uchar local_2b [8];
  uchar zeroes [15];
  uint32_t partial_block_len;
  mbedtls_chachapoly_context *ctx_local;
  
  zeroes._7_4_ = (uint)ctx->ciphertext_len & 0xf;
  if ((ctx->ciphertext_len & 0xf) == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    unique0x10000072 = ctx;
    memset(local_2b,0,0xf);
    ctx_local._4_4_ =
         mbedtls_poly1305_update
                   (&stack0xffffffffffffffe8->poly1305_ctx,local_2b,(ulong)(0x10 - zeroes._7_4_));
  }
  return ctx_local._4_4_;
}

Assistant:

static int chachapoly_pad_ciphertext( mbedtls_chachapoly_context *ctx )
{
    uint32_t partial_block_len = (uint32_t) ( ctx->ciphertext_len % 16U );
    unsigned char zeroes[15];

    if( partial_block_len == 0U )
        return( 0 );

    memset( zeroes, 0, sizeof( zeroes ) );
    return( mbedtls_poly1305_update( &ctx->poly1305_ctx,
                                     zeroes,
                                     16U - partial_block_len ) );
}